

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O3

char * parse_headers(char *buf,char *buf_end,phr_header *headers,size_t *num_headers,
                    size_t max_headers,int *ret)

{
  char cVar1;
  size_t sVar2;
  long lVar3;
  char *buf_start;
  size_t sVar4;
  char *pcVar5;
  size_t value_len;
  char *value;
  size_t local_40;
  char *local_38;
  
  if (buf != buf_end) {
    do {
      cVar1 = *buf;
      if (cVar1 == '\n') {
        return buf + 1;
      }
      if (cVar1 == '\r') {
        if (buf + 1 != buf_end) {
          if (buf[1] == '\n') {
            return buf + 2;
          }
LAB_0010bcb3:
          *ret = -1;
          return (char *)0x0;
        }
        break;
      }
      sVar2 = *num_headers;
      if (sVar2 == max_headers) goto LAB_0010bcb3;
      if ((sVar2 == 0) || ((cVar1 != '\t' && (cVar1 != ' ')))) {
        sVar4 = 0;
        while ((ulong)(byte)buf[sVar4] != 0x3a) {
          if (""[(byte)buf[sVar4]] == '\0') goto LAB_0010bcb3;
          lVar3 = sVar4 + 1;
          sVar4 = sVar4 + 1;
          if (buf + lVar3 == buf_end) goto LAB_0010bcaa;
        }
        headers[sVar2].name = buf;
        headers[sVar2].name_len = sVar4;
        if (headers[*num_headers].name_len == 0) goto LAB_0010bcb3;
        buf = buf + sVar4;
        do {
          buf = buf + 1;
          if (buf == buf_end) goto LAB_0010bcaa;
        } while ((*buf == ' ') || (*buf == '\t'));
      }
      else {
        headers[sVar2].name = (char *)0x0;
        headers[sVar2].name_len = 0;
      }
      buf = get_token_to_eol(buf,buf_end,&local_38,&local_40,ret);
      sVar2 = local_40;
      if (buf == (char *)0x0) {
        return (char *)0x0;
      }
      for (; pcVar5 = local_38, sVar2 != 0; sVar2 = sVar2 - 1) {
        if ((local_38[sVar2 - 1] != ' ') && (local_38[sVar2 - 1] != '\t')) {
          pcVar5 = local_38 + sVar2;
          break;
        }
      }
      sVar2 = *num_headers;
      headers[sVar2].value = local_38;
      headers[sVar2].value_len = (long)pcVar5 - (long)local_38;
      *num_headers = *num_headers + 1;
    } while (buf != buf_end);
  }
LAB_0010bcaa:
  *ret = -2;
  return (char *)0x0;
}

Assistant:

static const char *parse_headers(const char *buf, const char *buf_end, struct phr_header *headers, size_t *num_headers,
                                 size_t max_headers, int *ret)
{
    for (;; ++*num_headers) {
        CHECK_EOF();
        if (*buf == '\015') {
            ++buf;
            EXPECT_CHAR('\012');
            break;
        } else if (*buf == '\012') {
            ++buf;
            break;
        }
        if (*num_headers == max_headers) {
            *ret = -1;
            return NULL;
        }
        if (!(*num_headers != 0 && (*buf == ' ' || *buf == '\t'))) {
            /* parsing name, but do not discard SP before colon, see
             * http://www.mozilla.org/security/announce/2006/mfsa2006-33.html */
            if ((buf = parse_token(buf, buf_end, &headers[*num_headers].name, &headers[*num_headers].name_len, ':', ret)) == NULL) {
                return NULL;
            }
            if (headers[*num_headers].name_len == 0) {
                *ret = -1;
                return NULL;
            }
            ++buf;
            for (;; ++buf) {
                CHECK_EOF();
                if (!(*buf == ' ' || *buf == '\t')) {
                    break;
                }
            }
        } else {
            headers[*num_headers].name = NULL;
            headers[*num_headers].name_len = 0;
        }
        const char *value;
        size_t value_len;
        if ((buf = get_token_to_eol(buf, buf_end, &value, &value_len, ret)) == NULL) {
            return NULL;
        }
        /* remove trailing SPs and HTABs */
        const char *value_end = value + value_len;
        for (; value_end != value; --value_end) {
            const char c = *(value_end - 1);
            if (!(c == ' ' || c == '\t')) {
                break;
            }
        }
        headers[*num_headers].value = value;
        headers[*num_headers].value_len = value_end - value;
    }
    return buf;
}